

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makefiledeps.cpp
# Opt level: O0

void __thiscall SourceDependChildren::addChild(SourceDependChildren *this,SourceFile *s)

{
  int iVar1;
  void *pvVar2;
  undefined8 in_RSI;
  long *in_RDI;
  
  if ((int)in_RDI[1] <= *(int *)((long)in_RDI + 0xc)) {
    *(int *)(in_RDI + 1) = (int)in_RDI[1] + 200;
    pvVar2 = realloc((void *)*in_RDI,(long)(int)in_RDI[1] << 3);
    *in_RDI = (long)pvVar2;
  }
  iVar1 = *(int *)((long)in_RDI + 0xc);
  *(int *)((long)in_RDI + 0xc) = iVar1 + 1;
  *(undefined8 *)(*in_RDI + (long)iVar1 * 8) = in_RSI;
  return;
}

Assistant:

void addChild(SourceFile *s) {
        if(num_nodes <= used_nodes) {
            num_nodes += 200;
            children = (SourceFile**)realloc(children, sizeof(SourceFile*)*(num_nodes));
        }
        children[used_nodes++] = s;
    }